

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::call_exists(Dispatch_Engine *this,Function_Params *params)

{
  bool b;
  arity_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  undefined1 local_58 [32];
  Type_Conversions_State convs;
  
  if (*in_RDX != in_RDX[1]) {
    boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
              ((Dispatch_Engine *)local_58,(Boxed_Value *)params);
    convs.m_saves._M_data =
         threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*
                   ((Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> *)(params + 0xe)
                   );
    local_58._24_8_ = in_RDX[1];
    local_58._16_8_ = *in_RDX + 0x10;
    convs.m_conversions._M_data = (Type_Conversions *)&params[3].m_end;
    b = (bool)(**(code **)(*(long *)local_58._0_8_ + 0x18))();
    const_var((chaiscript *)this,b);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar1.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (arity_error *)__cxa_allocate_exception(0x18);
  chaiscript::exception::arity_error::arity_error
            (this_00,(int)((ulong)(in_RDX[1] - *in_RDX) >> 4),1);
  __cxa_throw(this_00,&chaiscript::exception::arity_error::typeinfo,std::range_error::~range_error);
}

Assistant:

Boxed_Value call_exists(const Function_Params &params) const {
        if (params.empty()) {
          throw chaiscript::exception::arity_error(static_cast<int>(params.size()), 1);
        }

        const auto &f = this->boxed_cast<Const_Proxy_Function>(params[0]);
        const Type_Conversions_State convs(m_conversions, m_conversions.conversion_saves());

        return const_var(f->call_match(Function_Params(params.begin() + 1, params.end()), convs));
      }